

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subst.c
# Opt level: O0

void cleanup_substitution(bsdtar *bsdtar)

{
  undefined8 *__ptr;
  undefined8 *__ptr_00;
  long in_RDI;
  substitution *subst;
  subst_rule *rule;
  
  __ptr = *(undefined8 **)(in_RDI + 0x118);
  if (__ptr != (undefined8 *)0x0) {
    while (__ptr_00 = (undefined8 *)*__ptr, __ptr_00 != (undefined8 *)0x0) {
      *__ptr = *__ptr_00;
      free((void *)__ptr_00[9]);
      free(__ptr_00);
    }
    free(__ptr);
  }
  return;
}

Assistant:

void
cleanup_substitution(struct bsdtar *bsdtar)
{
	struct subst_rule *rule;
	struct substitution *subst;

	if ((subst = bsdtar->substitution) == NULL)
		return;

	while ((rule = subst->first_rule) != NULL) {
		subst->first_rule = rule->next;
		free(rule->result);
		free(rule);
	}
	free(subst);
}